

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer2.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::IFF_Layer2::IFF_Layer2
          (IFF_Layer2 *this,BeamData *BD,SecondaryOperationalData *SOD,
          vector<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
          *FPD)

{
  KFLOAT32 KVar1;
  KFLOAT32 KVar2;
  KFLOAT32 KVar3;
  KUINT8 KVar4;
  KUINT16 KVar5;
  
  LayerHeader::LayerHeader(&this->super_LayerHeader);
  (this->super_LayerHeader).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__IFF_Layer2_00217638;
  (this->m_BmDt).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__BeamData_002257b8;
  KVar1 = BD->m_f32AziSwp;
  KVar2 = BD->m_f32EleCtr;
  KVar3 = BD->m_f32EleSwp;
  (this->m_BmDt).m_f32AziCtr = BD->m_f32AziCtr;
  (this->m_BmDt).m_f32AziSwp = KVar1;
  (this->m_BmDt).m_f32EleCtr = KVar2;
  (this->m_BmDt).m_f32EleSwp = KVar3;
  (this->m_BmDt).m_f32SwpSyn = BD->m_f32SwpSyn;
  (this->m_SOD).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SecondaryOperationalData_002181d0;
  KVar4 = SOD->m_ui8Param2;
  KVar5 = SOD->m_ui16NumFundParamSets;
  (this->m_SOD).m_ui8Param1 = SOD->m_ui8Param1;
  (this->m_SOD).m_ui8Param2 = KVar4;
  (this->m_SOD).m_ui16NumFundParamSets = KVar5;
  std::
  vector<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
  ::vector(&this->m_vFPD,FPD);
  (this->super_LayerHeader).m_ui8LayerNumber = '\x02';
  (this->super_LayerHeader).m_ui16LayerLength = 0x1c;
  return;
}

Assistant:

IFF_Layer2::IFF_Layer2( const BeamData & BD, const SecondaryOperationalData & SOD, const vector<IFF_ATC_NAVAIDS_FundamentalParameterData> & FPD ) :
    m_BmDt( BD ),
    m_SOD( SOD ),
    m_vFPD( FPD )
{
	m_ui8LayerNumber = 2;
	m_ui16LayerLength = IFF_LAYER2_SIZE;
}